

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

size_t __thiscall
llama_context::state_seq_load_file
          (llama_context *this,llama_seq_id seq_id,char *filepath,llama_token *tokens_out,
          size_t n_token_capacity,size_t *n_token_count_out)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong in_R8;
  ulong *in_R9;
  size_t nread;
  llama_io_read_file io;
  size_t state_size;
  uint32_t n_token_count;
  uint32_t version;
  uint32_t magic;
  llama_file file;
  llama_io_read_i *in_stack_ffffffffffffff08;
  llama_context *in_stack_ffffffffffffff10;
  size_t local_8;
  
  llama_file::llama_file
            ((llama_file *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
             (char *)0x3e0664);
  uVar3 = llama_file::read_u32((llama_file *)0x3e066e);
  uVar4 = llama_file::read_u32((llama_file *)0x3e068c);
  if ((uVar3 == 0x67677371) && (uVar4 == 2)) {
    uVar3 = llama_file::read_u32((llama_file *)0x3e0721);
    if (in_R8 < uVar3) {
      llama_log_internal(GGML_LOG_LEVEL_ERROR,
                         "%s: token count in sequence state file exceeded capacity! %u > %zu\n",
                         "state_seq_load_file",(ulong)uVar3,in_R8);
      local_8 = 0;
    }
    else {
      llama_file::read_raw
                ((llama_file *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0x3e07ac);
      *in_R9 = (ulong)uVar3;
      sVar5 = llama_file::size((llama_file *)0x3e07cf);
      sVar6 = llama_file::tell((llama_file *)0x3e07e3);
      llama_io_read_file::llama_io_read_file
                ((llama_io_read_file *)in_stack_ffffffffffffff10,
                 (llama_file *)in_stack_ffffffffffffff08);
      sVar7 = state_seq_read_data(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,0);
      if (sVar7 == 0) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to restore sequence state\n",
                           "state_seq_load_file");
        local_8 = 0;
        bVar2 = true;
      }
      else {
        if (sVar5 - sVar6 < sVar7) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x7c9,"GGML_ASSERT(%s) failed","nread <= state_size");
        }
        uVar1 = *in_R9;
        sVar5 = llama_file::tell((llama_file *)0x3e08f6);
        if (sVar7 + 0xc + uVar1 * 4 != sVar5) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                     ,0x7ca,"GGML_ASSERT(%s) failed",
                     "nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell()"
                    );
        }
        bVar2 = false;
      }
      llama_io_read_file::~llama_io_read_file((llama_io_read_file *)in_stack_ffffffffffffff10);
      if (!bVar2) {
        local_8 = llama_file::tell((llama_file *)0x3e095e);
      }
    }
  }
  else {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: unknown (magic, version) for sequence state file: %08x, %08x\n",
                       "state_seq_load_file",(ulong)uVar3,(ulong)uVar4);
    local_8 = 0;
  }
  llama_file::~llama_file((llama_file *)0x3e098a);
  return local_8;
}

Assistant:

size_t llama_context::state_seq_load_file(llama_seq_id seq_id, const char * filepath, llama_token * tokens_out, size_t n_token_capacity, size_t * n_token_count_out) {
    llama_file file(filepath, "rb");

    // version checks
    {
        const uint32_t magic   = file.read_u32();
        const uint32_t version = file.read_u32();

        if (magic != LLAMA_STATE_SEQ_MAGIC || version != LLAMA_STATE_SEQ_VERSION) {
            LLAMA_LOG_ERROR("%s: unknown (magic, version) for sequence state file: %08x, %08x\n", __func__, magic, version);
            return 0;
        }
    }

    // load the prompt
    {
        const uint32_t n_token_count = file.read_u32();

        if (n_token_count > n_token_capacity) {
            LLAMA_LOG_ERROR("%s: token count in sequence state file exceeded capacity! %u > %zu\n", __func__, n_token_count, n_token_capacity);
            return 0;
        }

        file.read_raw(tokens_out, sizeof(llama_token) * n_token_count);
        *n_token_count_out = n_token_count;
    }

    // restore the context state
    {
        const size_t state_size = file.size() - file.tell();
        llama_io_read_file io(&file);
        const size_t nread = state_seq_read_data(io, seq_id);
        if (!nread) {
            LLAMA_LOG_ERROR("%s: failed to restore sequence state\n", __func__);
            return 0;
        }
        GGML_ASSERT(nread <= state_size);
        GGML_ASSERT(nread + sizeof(uint32_t) * 3 + sizeof(llama_token) * *n_token_count_out == file.tell());
    }

    return file.tell();
}